

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WindowAttach(Parse *pParse,Expr *p,Window *pWin)

{
  Window *pWin_local;
  Expr *p_local;
  Parse *pParse_local;
  
  if (p == (Expr *)0x0) {
    sqlite3WindowDelete(pParse->db,pWin);
  }
  else if (pWin != (Window *)0x0) {
    (p->y).pWin = pWin;
    p->flags = p->flags | 0x1000000;
    pWin->pOwner = p;
    if ((p->flags & 2) != 0) {
      sqlite3ErrorMsg(pParse,"DISTINCT is not supported for window functions");
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowAttach(Parse *pParse, Expr *p, Window *pWin){
  if( p ){
    assert( p->op==TK_FUNCTION );
    /* This routine is only called for the parser.  If pWin was not
    ** allocated due to an OOM, then the parser would fail before ever
    ** invoking this routine */
    if( ALWAYS(pWin) ){
      p->y.pWin = pWin;
      ExprSetProperty(p, EP_WinFunc);
      pWin->pOwner = p;
      if( p->flags & EP_Distinct ){
        sqlite3ErrorMsg(pParse,
           "DISTINCT is not supported for window functions");
      }
    }
  }else{
    sqlite3WindowDelete(pParse->db, pWin);
  }
}